

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

VkPhysicalDeviceDynamicRenderingFeatures *
Fossilize::find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>(VkStructureType type,void *pNext)

{
  VkBaseInStructure *sin;
  void *pNext_local;
  VkStructureType type_local;
  
  sin = (VkBaseInStructure *)pNext;
  while( true ) {
    if (sin == (VkBaseInStructure *)0x0) {
      return (VkPhysicalDeviceDynamicRenderingFeatures *)0x0;
    }
    if (sin->sType == type) break;
    sin = sin->pNext;
  }
  return (VkPhysicalDeviceDynamicRenderingFeatures *)sin;
}

Assistant:

static inline const T *find_pnext(VkStructureType type, const void *pNext)
{
	while (pNext != nullptr)
	{
		auto *sin = static_cast<const VkBaseInStructure *>(pNext);
		if (sin->sType == type)
			return static_cast<const T*>(pNext);

		pNext = sin->pNext;
	}

	return nullptr;
}